

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ImageFeatureType::SerializeWithCachedSizes
          (ImageFeatureType *this,CodedOutputStream *output)

{
  uint32 uVar1;
  
  if (this->width_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->width_,output);
  }
  if (this->height_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->height_,output);
  }
  if (this->colorspace_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(3,this->colorspace_,output);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x15) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&((this->SizeFlexibility_).enumeratedsizes_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x1f) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&((this->SizeFlexibility_).enumeratedsizes_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ImageFeatureType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ImageFeatureType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 width = 1;
  if (this->width() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->width(), output);
  }

  // int64 height = 2;
  if (this->height() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->height(), output);
  }

  // .CoreML.Specification.ImageFeatureType.ColorSpace colorSpace = 3;
  if (this->colorspace() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      3, this->colorspace(), output);
  }

  // .CoreML.Specification.ImageFeatureType.EnumeratedImageSizes enumeratedSizes = 21;
  if (has_enumeratedsizes()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *SizeFlexibility_.enumeratedsizes_, output);
  }

  // .CoreML.Specification.ImageFeatureType.ImageSizeRange imageSizeRange = 31;
  if (has_imagesizerange()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *SizeFlexibility_.imagesizerange_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ImageFeatureType)
}